

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_generic::try_implicit_casts
          (type_caster_generic *this,handle src,bool convert)

{
  pointer ppVar1;
  bool bVar2;
  void *pvVar3;
  pointer ppVar4;
  type_caster_generic sub_caster;
  type_caster_generic tStack_48;
  
  ppVar4 = (this->typeinfo->implicit_casts).
           super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->typeinfo->implicit_casts).
           super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar4 == ppVar1) {
LAB_001223cb:
      return ppVar4 != ppVar1;
    }
    type_caster_generic(&tStack_48,ppVar4->first);
    bVar2 = load_impl<pybind11::detail::type_caster_generic>(&tStack_48,src,convert);
    if (bVar2) {
      pvVar3 = (*ppVar4->second)(tStack_48.value);
      this->value = pvVar3;
      goto LAB_001223cb;
    }
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

bool try_implicit_casts(handle src, bool convert) {
        for (auto &cast : typeinfo->implicit_casts) {
            type_caster_generic sub_caster(*cast.first);
            if (sub_caster.load(src, convert)) {
                value = cast.second(sub_caster.value);
                return true;
            }
        }
        return false;
    }